

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::MergeNewHeapBlock(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                    *this,SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>
                          *heapBlock)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined8 *in_FS_OFFSET;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_local;
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  uVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectSize
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  if (uVar3 != (this->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x646,"(heapBlock->GetObjectSize() == this->sizeCat)",
                       "heapBlock->GetObjectSize() == this->sizeCat");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::SetNextBlock
            (&heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>,
             &this->heapBlockList->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>
            );
  this->heapBlockList = heapBlock;
  InterlockedDecrement<unsigned_int>(&(this->super_HeapBucket).newHeapBlockCount);
  (this->super_HeapBucket).heapBlockCount = (this->super_HeapBucket).heapBlockCount + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::MergeNewHeapBlock(TBlockType * heapBlock)
{
    Assert(heapBlock->GetObjectSize() == this->sizeCat);
    heapBlock->SetNextBlock(this->heapBlockList);
    this->heapBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    ::InterlockedDecrement(&this->newHeapBlockCount);
    this->heapBlockCount++;
#endif
}